

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall
t_rb_generator::generate_rb_function_helpers(t_rb_generator *this,t_function *tfunction)

{
  t_program *program;
  t_type *type;
  t_struct *ptVar1;
  int iVar2;
  pointer pptVar3;
  t_field success;
  t_struct result;
  allocator local_1b9;
  string local_1b8;
  t_field local_198;
  t_struct local_e8;
  
  program = (this->super_t_oop_generator).super_t_generator.program_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198,
                 &tfunction->name_,"_result");
  t_struct::t_struct(&local_e8,program,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  type = tfunction->returntype_;
  std::__cxx11::string::string((string *)&local_1b8,"success",&local_1b9);
  t_field::t_field(&local_198,type,&local_1b8,0);
  std::__cxx11::string::~string((string *)&local_1b8);
  iVar2 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
  if ((char)iVar2 == '\0') {
    t_struct::append(&local_e8,&local_198);
  }
  ptVar1 = tfunction->xceptions_;
  for (pptVar3 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar3 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    t_struct::append(&local_e8,*pptVar3);
  }
  generate_rb_struct(this,&this->f_service_,&local_e8,false);
  t_field::~t_field(&local_198);
  t_struct::~t_struct(&local_e8);
  return;
}

Assistant:

void t_rb_generator::generate_rb_function_helpers(t_function* tfunction) {
  t_struct result(program_, tfunction->get_name() + "_result");
  t_field success(tfunction->get_returntype(), "success", 0);
  if (!tfunction->get_returntype()->is_void()) {
    result.append(&success);
  }

  t_struct* xs = tfunction->get_xceptions();
  const vector<t_field*>& fields = xs->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    result.append(*f_iter);
  }
  generate_rb_struct(f_service_, &result);
}